

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

string * __thiscall
Parse::toCatName_abi_cxx11_(string *__return_storage_ptr__,Parse *this,Category cat)

{
  code *pcVar1;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [16];
  allocator local_1d;
  Category local_1c;
  Parse *pPStack_18;
  Category cat_local;
  Parse *this_local;
  
  local_1c = cat;
  pPStack_18 = this;
  this_local = (Parse *)__return_storage_ptr__;
  if (cat == VARIABLE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"var",&local_1d);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d);
  }
  else if (cat == FORMALPARAM) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"vf",local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  else if (cat == FUNCTION) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"func",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  }
  else {
    if (cat != CONST) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"const",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
  }
  return __return_storage_ptr__;
}

Assistant:

string Parse::toCatName(Category cat) {
    if(cat == Category::VARIABLE) {
        return "var";
    } else if(cat == Category::FORMALPARAM) {
        return "vf";
    } else if(cat == Category::FUNCTION) {
        return "func";
    } else if(cat == Category::CONST) {
        return "const";
    }
}